

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# survey_test.c
# Opt level: O0

void test_surv_cancel_abort_recv(void)

{
  nng_err nVar1;
  int iVar2;
  nng_err num;
  char *pcVar3;
  char *pcVar4;
  bool bVar5;
  undefined4 uVar6;
  nng_err result__16;
  nng_err result__15;
  int rv__2;
  size_t sz__2;
  char buf__2 [64];
  nng_err result__14;
  int rv__1;
  size_t sz__1;
  char buf__1 [64];
  nng_err result__13;
  int rv_;
  size_t sz_;
  char buf_ [64];
  nng_err result__12;
  nng_err result__11;
  nng_err result__10;
  nng_err result__9;
  nng_err result__8;
  nng_err result__7;
  nng_err result__6;
  nng_err result__5;
  nng_err result__4;
  nng_err result__3;
  nng_err result__2;
  nng_err result__1;
  nng_err result_;
  nng_socket resp;
  nng_socket surv;
  nng_duration time;
  nng_aio *aio;
  
  resp.id = 10000;
  nVar1 = nng_respondent0_open((nng_socket *)&result__1);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/survey0/survey_test.c"
                         ,0xd7,"%s: expected success, got %s (%d)","nng_respondent0_open(&resp)",
                         pcVar3,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_surveyor0_open((nng_socket *)&result_);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/survey0/survey_test.c"
                         ,0xd8,"%s: expected success, got %s (%d)","nng_surveyor0_open(&surv)",
                         pcVar3,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_aio_alloc((nng_aio **)&surv,(_func_void_void_ptr *)0x0,(void *)0x0);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/survey0/survey_test.c"
                         ,0xd9,"%s: expected success, got %s (%d)","nng_aio_alloc(&aio, NULL, NULL)"
                         ,pcVar3,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_socket_set_ms((nng_socket)result_,"surveyor:survey-time",resp.id);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/survey0/survey_test.c"
                         ,0xdb,"%s: expected success, got %s (%d)",
                         "nng_socket_set_ms(surv, NNG_OPT_SURVEYOR_SURVEYTIME, time)",pcVar3,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_socket_set_int((nng_socket)result_,"send-buffer",0x10);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/survey0/survey_test.c"
                         ,0xdc,"%s: expected success, got %s (%d)",
                         "nng_socket_set_int(surv, NNG_OPT_SENDBUF, 16)",pcVar3,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_socket_set_ms((nng_socket)result_,"recv-timeout",5000);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/survey0/survey_test.c"
                         ,0xdd,"%s: expected success, got %s (%d)",
                         "nng_socket_set_ms(surv, NNG_OPT_RECVTIMEO, 5 * SECOND)",pcVar3,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_socket_set_ms((nng_socket)result__1,"recv-timeout",5000);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/survey0/survey_test.c"
                         ,0xde,"%s: expected success, got %s (%d)",
                         "nng_socket_set_ms(resp, NNG_OPT_RECVTIMEO, 5 * SECOND)",pcVar3,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_socket_set_ms((nng_socket)result_,"send-timeout",5000);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/survey0/survey_test.c"
                         ,0xdf,"%s: expected success, got %s (%d)",
                         "nng_socket_set_ms(surv, NNG_OPT_SENDTIMEO, 5 * SECOND)",pcVar3,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_socket_set_ms((nng_socket)result__1,"send-timeout",5000);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/survey0/survey_test.c"
                         ,0xe0,"%s: expected success, got %s (%d)",
                         "nng_socket_set_ms(resp, NNG_OPT_SENDTIMEO, 5 * SECOND)",pcVar3,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nuts_marry((nng_socket)result__1,(nng_socket)result_);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/survey0/survey_test.c"
                         ,0xe2,"%s: expected success, got %s (%d)","nuts_marry(resp, surv)",pcVar3,
                         nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_send((nng_socket)result_,"abc",4,0);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/survey0/survey_test.c"
                         ,0xe5,"%s: expected success, got %s (%d)",
                         "nng_send(surv, \"abc\", strlen(\"abc\") + 1, 0)",pcVar3,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nuts_sleep(100);
  nng_aio_set_timeout(_surv,5000);
  nng_socket_recv((nng_socket)result_,_surv);
  nuts_sleep(100);
  nVar1 = nng_send((nng_socket)result_,"def",4,0);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/survey0/survey_test.c"
                         ,0xf4,"%s: expected success, got %s (%d)",
                         "nng_send(surv, \"def\", strlen(\"def\") + 1, 0)",pcVar3,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nng_aio_wait(_surv);
  num = nng_aio_result(_surv);
  pcVar3 = nng_strerror(NNG_ECANCELED);
  acutest_check_((uint)(num == NNG_ECANCELED),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/survey0/survey_test.c"
                 ,0xf8,"%s fails with %s","nng_aio_result(aio)",pcVar3,nVar1);
  pcVar3 = nng_strerror(NNG_ECANCELED);
  pcVar4 = nng_strerror(num);
  acutest_message_("%s: expected %s (%d), got %s (%d)","nng_aio_result(aio)",pcVar3,0x14,pcVar4,
                   (ulong)num);
  _result__13 = 0x40;
  nVar1 = nng_recv((nng_socket)result__1,&sz_,(size_t *)&result__13,0);
  buf__1._60_4_ = nVar1;
  pcVar3 = nng_strerror(nVar1);
  acutest_check_((uint)(nVar1 == NNG_OK),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/survey0/survey_test.c"
                 ,0xfb,"nng_recv (%d %s)",(ulong)nVar1,pcVar3);
  acutest_check_((uint)(_result__13 == 4),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/survey0/survey_test.c"
                 ,0xfb,"length %d want %d",_result__13 & 0xffffffff,4);
  buf_[0x37] = '\0';
  iVar2 = strcmp("abc",(char *)&sz_);
  acutest_check_((uint)(iVar2 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/survey0/survey_test.c"
                 ,0xfb,"%s == %s","abc",&sz_);
  buf__1._56_4_ = nng_send((nng_socket)result__1,"abc",4,0);
  bVar5 = buf__1._56_4_ == NNG_OK;
  pcVar3 = nng_strerror(buf__1._56_4_);
  uVar6 = buf__1._56_4_;
  iVar2 = acutest_check_((uint)bVar5,
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/survey0/survey_test.c"
                         ,0xff,"%s: expected success, got %s (%d)",
                         "nng_send(resp, \"abc\", strlen(\"abc\") + 1, 0)",pcVar3,buf__1._56_4_);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  _result__14 = 0x40;
  nVar1 = nng_recv((nng_socket)result__1,&sz__1,(size_t *)&result__14,0);
  buf__2._60_4_ = nVar1;
  pcVar3 = nng_strerror(nVar1);
  acutest_check_((uint)(nVar1 == NNG_OK),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/survey0/survey_test.c"
                 ,0x102,"nng_recv (%d %s)",(ulong)nVar1,pcVar3,uVar6);
  acutest_check_((uint)(_result__14 == 4),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/survey0/survey_test.c"
                 ,0x102,"length %d want %d",_result__14 & 0xffffffff,4);
  buf__1[0x37] = '\0';
  iVar2 = strcmp("def",(char *)&sz__1);
  acutest_check_((uint)(iVar2 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/survey0/survey_test.c"
                 ,0x102,"%s == %s","def",&sz__1);
  buf__2._56_4_ = nng_send((nng_socket)result__1,"def",4,0);
  bVar5 = buf__2._56_4_ == NNG_OK;
  pcVar3 = nng_strerror(buf__2._56_4_);
  uVar6 = buf__2._56_4_;
  iVar2 = acutest_check_((uint)bVar5,
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/survey0/survey_test.c"
                         ,0x105,"%s: expected success, got %s (%d)",
                         "nng_send(resp, \"def\", strlen(\"def\") + 1, 0)",pcVar3,buf__2._56_4_);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  _result__15 = 0x40;
  nVar1 = nng_recv((nng_socket)result_,&sz__2,(size_t *)&result__15,0);
  pcVar3 = nng_strerror(nVar1);
  acutest_check_((uint)(nVar1 == NNG_OK),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/survey0/survey_test.c"
                 ,0x108,"nng_recv (%d %s)",(ulong)nVar1,pcVar3,uVar6);
  acutest_check_((uint)(_result__15 == 4),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/survey0/survey_test.c"
                 ,0x108,"length %d want %d",_result__15 & 0xffffffff,4);
  buf__2[0x37] = '\0';
  iVar2 = strcmp("def",(char *)&sz__2);
  acutest_check_((uint)(iVar2 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/survey0/survey_test.c"
                 ,0x108,"%s == %s","def",&sz__2);
  nng_aio_free(_surv);
  nVar1 = nng_socket_close((nng_socket)result_);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/survey0/survey_test.c"
                         ,0x10b,"%s: expected success, got %s (%d)","nng_socket_close(surv)",pcVar3,
                         nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_socket_close((nng_socket)result__1);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/survey0/survey_test.c"
                         ,0x10c,"%s: expected success, got %s (%d)","nng_socket_close(resp)",pcVar3,
                         nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  return;
}

Assistant:

void
test_surv_cancel_abort_recv(void)
{
	nng_aio     *aio;
	nng_duration time = SECOND * 10; // 10s (kind of never)
	nng_socket   surv;
	nng_socket   resp;

	NUTS_PASS(nng_respondent0_open(&resp));
	NUTS_PASS(nng_surveyor0_open(&surv));
	NUTS_PASS(nng_aio_alloc(&aio, NULL, NULL));

	NUTS_PASS(nng_socket_set_ms(surv, NNG_OPT_SURVEYOR_SURVEYTIME, time));
	NUTS_PASS(nng_socket_set_int(surv, NNG_OPT_SENDBUF, 16));
	NUTS_PASS(nng_socket_set_ms(surv, NNG_OPT_RECVTIMEO, 5 * SECOND));
	NUTS_PASS(nng_socket_set_ms(resp, NNG_OPT_RECVTIMEO, 5 * SECOND));
	NUTS_PASS(nng_socket_set_ms(surv, NNG_OPT_SENDTIMEO, 5 * SECOND));
	NUTS_PASS(nng_socket_set_ms(resp, NNG_OPT_SENDTIMEO, 5 * SECOND));

	NUTS_MARRY(resp, surv);

	// Send survey #1 (abc).
	NUTS_SEND(surv, "abc");

	// Wait for it to get ot the other side.
	NUTS_SLEEP(100);

	nng_aio_set_timeout(aio, 5 * SECOND);
	nng_socket_recv(surv, aio);

	// Give time for this recv to post properly.
	NUTS_SLEEP(100);

	// Send the next request ("def").  Note that
	// the respondent side server will have already buffered the receive
	// request, and should simply be waiting for us to reply to
	// abc.
	NUTS_SEND(surv, "def");

	// Our pending I/O should have been canceled.
	nng_aio_wait(aio);
	NUTS_FAIL(nng_aio_result(aio), NNG_ECANCELED);

	// Receive the first request (should be abc) on the respondent.
	NUTS_RECV(resp, "abc");

	// Respondent sends the reply to first survey.  This will be
	// discarded by the SURV socket.
	NUTS_SEND(resp, "abc");

	// Now get the next survey from the RESP; should be "def".
	NUTS_RECV(resp, "def");

	// And send it back to REQ.
	NUTS_SEND(resp, "def");

	// Try a req command.  This should give back "def"
	NUTS_RECV(surv, "def");

	nng_aio_free(aio);
	NUTS_CLOSE(surv);
	NUTS_CLOSE(resp);
}